

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::LoadPreservedBPInfo
          (ExecutionInfoManager *this,ThreadContext *threadContext)

{
  undefined8 uVar1;
  code *pcVar2;
  anon_class_16_2_108fe19d map;
  bool bVar3;
  int iVar4;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  ScriptContext **ppSVar5;
  DebugContext *this_01;
  ProbeContainer *this_02;
  Type *pTVar6;
  int local_9c;
  int32 j;
  ProbeContainer *probeContainer;
  List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  bpIdsToDelete;
  ScriptContext *ctx;
  int32 i;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *ctxs;
  TTDebuggerSourceLocation *local_20;
  ThreadContext *local_18;
  ThreadContext *threadContext_local;
  ExecutionInfoManager *this_local;
  
  local_18 = threadContext;
  threadContext_local = (ThreadContext *)this;
  while( true ) {
    local_20 = (TTDebuggerSourceLocation *)0x0;
    bVar3 = JsUtil::
            ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>::
            Contains(&(this->m_unRestoredBreakpoints).
                      super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,&local_20);
    if (!bVar3) break;
    ctxs = (List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
    JsUtil::
    List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Remove(&this->m_unRestoredBreakpoints,(TTDebuggerSourceLocation **)&ctxs);
  }
  this_00 = ThreadContextTTD::GetTTDContexts(local_18->TTDContext);
  ctx._4_4_ = 0;
  while( true ) {
    iVar4 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                      (&this_00->
                        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                      );
    if (iVar4 <= ctx._4_4_) break;
    ppSVar5 = JsUtil::
              List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,ctx._4_4_);
    bpIdsToDelete._40_8_ = *ppSVar5;
    JsUtil::List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)&probeContainer,&Memory::HeapAllocator::Instance,4);
    this_01 = Js::ScriptContext::GetDebugContext((ScriptContext *)bpIdsToDelete._40_8_);
    this_02 = Js::DebugContext::GetProbeContainer(this_01);
    map.bpIdsToDelete =
         (List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
         &probeContainer;
    map.this = this;
    Js::ProbeContainer::
    MapProbes<TTD::ExecutionInfoManager::LoadPreservedBPInfo(ThreadContext*)::__0>(this_02,map);
    local_9c = 0;
    while( true ) {
      iVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>::Count
                        ((ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer> *)
                         &probeContainer);
      if (iVar4 <= local_9c) break;
      uVar1 = *(undefined8 *)(bpIdsToDelete._40_8_ + 0x13f8);
      pcVar2 = *(code **)(bpIdsToDelete._40_8_ + 0x1410);
      pTVar6 = JsUtil::
               List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)&probeContainer,local_9c);
      (*pcVar2)(uVar1,*pTVar6);
      local_9c = local_9c + 1;
    }
    iVar4 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                      (&this_00->
                        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                      );
    if (ctx._4_4_ == iVar4 + -1) {
      (**(code **)(bpIdsToDelete._40_8_ + 0x1418))(*(undefined8 *)(bpIdsToDelete._40_8_ + 0x13f8));
    }
    JsUtil::List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::~List((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)&probeContainer);
    ctx._4_4_ = ctx._4_4_ + 1;
  }
  return;
}

Assistant:

void ExecutionInfoManager::LoadPreservedBPInfo(ThreadContext* threadContext)
    {
        while(this->m_unRestoredBreakpoints.Contains(nullptr))
        {
            this->m_unRestoredBreakpoints.Remove(nullptr);
        }

        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& ctxs = threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < ctxs.Count(); ++i)
        {
            Js::ScriptContext* ctx = ctxs.Item(i);
            JsUtil::List<uint32, HeapAllocator> bpIdsToDelete(&HeapAllocator::Instance);

            Js::ProbeContainer* probeContainer = ctx->GetDebugContext()->GetProbeContainer();
            probeContainer->MapProbes([&](int j, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if((int64)bp->GetId() != this->m_activeBPId)
                {
                    Js::FunctionBody* body = bp->GetFunctionBody();
                    int32 bpIndex = body->GetEnclosingStatementIndexFromByteCode(bp->GetBytecodeOffset());

                    ULONG srcLine = 0;
                    LONG srcColumn = -1;
                    uint32 startOffset = body->GetStatementStartOffset(bpIndex);
                    body->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

                    TTDebuggerSourceLocation* bpLocation = TT_HEAP_NEW(TTDebuggerSourceLocation);
                    bpLocation->SetLocationWithBP(bp->GetId(), body, srcLine, srcColumn);
                    this->m_unRestoredBreakpoints.Add(bpLocation);

                    bpIdsToDelete.Add(bp->GetId());
                }
            });

            for(int32 j = 0; j < bpIdsToDelete.Count(); ++j)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPDeleteCallback(ctx->TTDHostCallbackFunctor.HostRuntime, bpIdsToDelete.Item(j));
            }

            //done with last context so release the debug document dictionary info
            if(i == ctxs.Count() - 1)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPClearDocumentCallback(ctx->TTDHostCallbackFunctor.HostRuntime);
            }
        }
    }